

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

Reg ra_rematk(ASMState *as,IRRef ref)

{
  byte bVar1;
  uint r_00;
  IRIns *ir_00;
  Reg r;
  IRIns *ir;
  IRRef ref_local;
  ASMState *as_local;
  
  ir_00 = as->ir + ref;
  bVar1 = (ir_00->field_1).r;
  r_00 = (uint)bVar1;
  as->freeset = 1 << (bVar1 & 0x1f) | as->freeset;
  as->modset = 1 << (bVar1 & 0x1f) | as->modset;
  (ir_00->field_1).r = 0xff;
  if ((ir_00->field_1).o == '\x1c') {
    emit_loadk64(as,r_00,ir_00);
  }
  else if ((ir_00->field_1).o == '\r') {
    (ir_00->field_1).r = 0x82;
    emit_rma(as,XO_MOV,r_00 | 0x80200,as->J[-1].penalty + 0x3c);
  }
  else if ((ir_00->field_1).o == '\x16') {
    emit_rma(as,XO_MOV,r_00 | 0x80200,&as->J[-1].penalty[0x3b].val);
  }
  else if ((ir_00->field_1).o == '\x1d') {
    emit_loadu64(as,r_00,(uint64_t)ir_00[1]);
  }
  else if ((ir_00->field_1).o == '\x18') {
    emit_loadu64(as,r_00,(uint64_t)ir_00[1]);
  }
  else if (((ir_00->field_1).o == '\x19') || ((ir_00->field_1).o == '\x1a')) {
    emit_loadu64(as,r_00,(uint64_t)ir_00[1]);
  }
  else {
    emit_loadi(as,r_00,ir_00->i);
  }
  return r_00;
}

Assistant:

static Reg ra_rematk(ASMState *as, IRRef ref)
{
  IRIns *ir;
  Reg r;
  if (ra_iskref(ref)) {
    r = ra_krefreg(ref);
    lj_assertA(!rset_test(as->freeset, r), "rematk of free reg %d", r);
    ra_free(as, r);
    ra_modified(as, r);
#if LJ_64
    emit_loadu64(as, r, ra_krefk(as, ref));
#else
    emit_loadi(as, r, ra_krefk(as, ref));
#endif
    return r;
  }
  ir = IR(ref);
  r = ir->r;
  lj_assertA(ra_hasreg(r), "rematk of K%03d has no reg", REF_BIAS - ref);
  lj_assertA(!ra_hasspill(ir->s),
	     "rematk of K%03d has spill slot [%x]", REF_BIAS - ref, ir->s);
  ra_free(as, r);
  ra_modified(as, r);
  ir->r = RID_INIT;  /* Do not keep any hint. */
  RA_DBGX((as, "remat     $i $r", ir, r));
#if !LJ_SOFTFP32
  if (ir->o == IR_KNUM) {
    emit_loadk64(as, r, ir);
  } else
#endif
  if (emit_canremat(REF_BASE) && ir->o == IR_BASE) {
    ra_sethint(ir->r, RID_BASE);  /* Restore BASE register hint. */
    emit_getgl(as, r, jit_base);
  } else if (emit_canremat(ASMREF_L) && ir->o == IR_KPRI) {
    /* REF_NIL stores ASMREF_L register. */
    lj_assertA(irt_isnil(ir->t), "rematk of bad ASMREF_L");
    emit_getgl(as, r, cur_L);
#if LJ_64
  } else if (ir->o == IR_KINT64) {
    emit_loadu64(as, r, ir_kint64(ir)->u64);
#if LJ_GC64
  } else if (ir->o == IR_KGC) {
    emit_loadu64(as, r, (uintptr_t)ir_kgc(ir));
  } else if (ir->o == IR_KPTR || ir->o == IR_KKPTR) {
    emit_loadu64(as, r, (uintptr_t)ir_kptr(ir));
#endif
#endif
  } else {
    lj_assertA(ir->o == IR_KINT || ir->o == IR_KGC ||
	       ir->o == IR_KPTR || ir->o == IR_KKPTR || ir->o == IR_KNULL,
	       "rematk of bad IR op %d", ir->o);
    emit_loadi(as, r, ir->i);
  }
  return r;
}